

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.c
# Opt level: O2

void draw_time(nh_player_info *pi)

{
  uint uVar1;
  attr_t aVar2;
  int nh_color;
  
  if (settings.time == '\0') {
    return;
  }
  uVar1 = player.moves - old_player.moves;
  if (1 < (int)uVar1) {
    if (uVar1 < 100) {
      if (uVar1 < 0x32) {
        if (uVar1 < 0x14) {
          nh_color = (uint)(9 < uVar1) * 2 + 2;
        }
        else {
          nh_color = 6;
        }
      }
      else {
        nh_color = 0xb;
      }
    }
    else {
      nh_color = 1;
    }
    aVar2 = curses_color_attr(nh_color,0);
    wattr_on(statuswin,aVar2,0);
    wprintw(statuswin,"T:%ld",player.moves);
    wattr_off(statuswin,aVar2,0);
    return;
  }
  wprintw(statuswin,"T:%ld");
  return;
}

Assistant:

static void draw_time(const struct nh_player_info *pi)
{
    const struct nh_player_info *oldpi = &old_player;
    int movediff;
    attr_t colorattr;
    nh_bool colorchange;

    if (!settings.time)
	return;

    /* Give players a better idea of the passage of time. */
    movediff = pi->moves - oldpi->moves;
    if (movediff > 1) {
	colorattr = curses_color_attr(
			(movediff >= 100) ? CLR_RED :
			(movediff >=  50) ? CLR_YELLOW :
			(movediff >=  20) ? CLR_CYAN :
			(movediff >=  10) ? CLR_BLUE :
					    CLR_GREEN, 0);
	colorchange = TRUE;
    } else {
	colorchange = FALSE;
    }

    if (colorchange)
	wattron(statuswin, colorattr);
    wprintw(statuswin, "T:%ld", pi->moves);
    if (colorchange)
	wattroff(statuswin, colorattr);
}